

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hvtool.cpp
# Opt level: O2

void __thiscall dumper::dumproot(dumper *this)

{
  uint uVar1;
  roots *prVar2;
  allocator<char> local_39;
  string local_38;
  
  prVar2 = getroot(this,0);
  if (prVar2 != (roots *)0x0) {
    (*this->_vptr_dumper[4])(this,prVar2);
    uVar1 = *(prVar2->_roots).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
             _M_impl.super__Vector_impl_data._M_start;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"HKCR",&local_39);
    dumpkeys(this,uVar1 & 0xfffffff,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    uVar1 = (prVar2->_roots).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
            .super__Vector_impl_data._M_start[1];
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"HKCU",&local_39);
    dumpkeys(this,uVar1 & 0xfffffff,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    uVar1 = (prVar2->_roots).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
            .super__Vector_impl_data._M_start[2];
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"HKLM",&local_39);
    dumpkeys(this,uVar1 & 0xfffffff,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    return;
  }
  puts("could not find root");
  return;
}

Assistant:

void dumproot()            
    {
        ent::roots *r= getroot(0);
        if (!r) {
            printf("could not find root\n");
            return;
        }
        dumproots(r);

        dumpkeys(r->hiveid((HKEY)ent::HKCR), "HKCR");
        dumpkeys(r->hiveid((HKEY)ent::HKCU), "HKCU");
        dumpkeys(r->hiveid((HKEY)ent::HKLM), "HKLM");
    }